

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool tinygltf::ParseIntegerProperty
               (int *ret,string *err,json *o,string *property,bool required,string *parent_node)

{
  bool bVar1;
  reference o_00;
  int intValue;
  json_const_iterator it;
  int local_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  json_const_iterator local_58;
  
  local_58.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_58.m_object = (pointer)0x0;
  local_58.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_58.m_it.primitive_iterator.m_it = -0x8000000000000000;
  bVar1 = anon_unknown_57::FindMember(o,(property->_M_dataplus)._M_p,&local_58);
  if (bVar1) {
    o_00 = nlohmann::detail::
           iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           ::operator*(&local_58);
    bVar1 = anon_unknown_57::GetInt(o_00,&local_9c);
    if (bVar1) {
      if (ret != (int *)0x0) {
        *ret = local_9c;
      }
    }
    else if (required && err != (string *)0x0) {
      std::operator+(&local_78,"\'",property);
      std::operator+(&local_98,&local_78,"\' property is not an integer type.\n");
      std::__cxx11::string::append((string *)err);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  else {
    if (required && err != (string *)0x0) {
      std::operator+(&local_78,"\'",property);
      std::operator+(&local_98,&local_78,"\' property is missing");
      std::__cxx11::string::append((string *)err);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_78);
      if (parent_node->_M_string_length != 0) {
        std::operator+(&local_98," in ",parent_node);
        std::__cxx11::string::append((string *)err);
        std::__cxx11::string::~string((string *)&local_98);
      }
      std::__cxx11::string::append((char *)err);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool ParseIntegerProperty(int *ret, std::string *err, const json &o,
                                 const std::string &property,
                                 const bool required,
                                 const std::string &parent_node = "") {
  json_const_iterator it;
  if (!FindMember(o, property.c_str(), it)) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is missing";
        if (!parent_node.empty()) {
          (*err) += " in " + parent_node;
        }
        (*err) += ".\n";
      }
    }
    return false;
  }

  int intValue;
  bool isInt = GetInt(GetValue(it), intValue);
  if (!isInt) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is not an integer type.\n";
      }
    }
    return false;
  }

  if (ret) {
    (*ret) = intValue;
  }

  return true;
}